

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void collect_gradient_attributes(element_t *element,gradient_attributes_t *attributes)

{
  _Bool _Var1;
  element *local_20;
  element_t *child;
  gradient_attributes_t *attributes_local;
  element_t *element_local;
  
  if ((attributes->units == (element_t *)0x0) && (_Var1 = has_attribute(element,0xf), _Var1)) {
    attributes->units = element;
  }
  if ((attributes->spread == (element_t *)0x0) && (_Var1 = has_attribute(element,0x1a), _Var1)) {
    attributes->spread = element;
  }
  if ((attributes->transform == (element_t *)0x0) && (_Var1 = has_attribute(element,0xe), _Var1)) {
    attributes->transform = element;
  }
  if (attributes->stops == (element_t *)0x0) {
    for (local_20 = element->first_child; local_20 != (element *)0x0;
        local_20 = local_20->next_sibling) {
      if (local_20->id == 0xe) {
        attributes->stops = element;
        return;
      }
    }
  }
  return;
}

Assistant:

static void collect_gradient_attributes(const element_t* element, gradient_attributes_t* attributes)
{
    if(attributes->units == NULL && has_attribute(element, ATTR_GRADIENT_UNITS))
        attributes->units = element;
    if(attributes->spread == NULL && has_attribute(element, ATTR_SPREAD_METHOD))
        attributes->spread = element;
    if(attributes->transform == NULL && has_attribute(element, ATTR_GRADIENT_TRANSFORM))
        attributes->transform = element;
    if(attributes->stops == NULL) {
        for(const element_t* child = element->first_child; child; child = child->next_sibling) {
            if(child->id == TAG_STOP) {
                attributes->stops = element;
                break;
            }
        }
    }
}